

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O1

bool __thiscall cmExportSet::Compute(cmExportSet *this,cmLocalGenerator *lg)

{
  pointer puVar1;
  pointer pbVar2;
  bool bVar3;
  cmGeneratorTarget *pcVar4;
  long lVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  pointer puVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interfaceFileSets;
  bool local_69;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  pointer local_40;
  cmLocalGenerator *local_38;
  
  puVar7 = (this->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_69 = puVar7 == puVar1;
  if (!local_69) {
    do {
      pcVar4 = cmLocalGenerator::FindGeneratorTargetToUse
                         (lg,&((puVar7->_M_t).
                               super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                               .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                              TargetName);
      ((puVar7->_M_t).super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>.
       _M_t.super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
       super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target = pcVar4;
      cmTarget::GetAllInterfaceFileSets_abi_cxx11_
                (&local_58,
                 ((puVar7->_M_t).
                  super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
                  super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                  super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target->Target);
      pbVar2 = local_58.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar5 = (long)local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_58.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 7;
      __it._M_current =
           local_58.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_40 = puVar7;
      local_38 = lg;
      if (0 < lVar5) {
        lVar5 = lVar5 + 1;
        do {
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it);
          _Var6._M_current = __it._M_current;
          if (bVar3) goto LAB_00304948;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 1);
          _Var6._M_current = __it._M_current + 1;
          if (bVar3) goto LAB_00304948;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 2);
          _Var6._M_current = __it._M_current + 2;
          if (bVar3) goto LAB_00304948;
          bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                  operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40
                             ,__it._M_current + 3);
          _Var6._M_current = __it._M_current + 3;
          if (bVar3) goto LAB_00304948;
          __it._M_current = __it._M_current + 4;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
      lVar5 = (long)pbVar2 - (long)__it._M_current >> 5;
      if (lVar5 == 1) {
LAB_00304934:
        bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                           __it);
        _Var6._M_current = __it._M_current;
        if (!bVar3) {
          _Var6._M_current = pbVar2;
        }
      }
      else if (lVar5 == 2) {
LAB_00304921:
        bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)&local_40,
                           __it);
        _Var6._M_current = __it._M_current;
        if (!bVar3) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00304934;
        }
      }
      else {
        _Var6._M_current = pbVar2;
        if ((lVar5 == 3) &&
           (bVar3 = __gnu_cxx::__ops::_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::$_0>::
                    operator()((_Iter_negate<cmExportSet::Compute(cmLocalGenerator*)::__0> *)
                               &local_40,__it), _Var6._M_current = __it._M_current, !bVar3)) {
          __it._M_current = __it._M_current + 1;
          goto LAB_00304921;
        }
      }
LAB_00304948:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_58);
      if (_Var6._M_current != pbVar2) {
        return local_69;
      }
      puVar7 = puVar7 + 1;
      local_69 = puVar7 == puVar1;
    } while (!local_69);
  }
  return local_69;
}

Assistant:

bool cmExportSet::Compute(cmLocalGenerator* lg)
{
  for (std::unique_ptr<cmTargetExport>& tgtExport : this->TargetExports) {
    tgtExport->Target = lg->FindGeneratorTargetToUse(tgtExport->TargetName);

    auto const interfaceFileSets =
      tgtExport->Target->Target->GetAllInterfaceFileSets();
    auto const fileSetInTargetExport =
      [&tgtExport, lg](const std::string& fileSetName) -> bool {
      auto* fileSet = tgtExport->Target->Target->GetFileSet(fileSetName);

      if (!tgtExport->FileSetGenerators.count(fileSet)) {
        lg->IssueMessage(MessageType::FATAL_ERROR,
                         cmStrCat("File set \"", fileSetName,
                                  "\" is listed in interface file sets of ",
                                  tgtExport->Target->GetName(),
                                  " but has not been exported"));
        return false;
      }
      return true;
    };

    if (!std::all_of(interfaceFileSets.begin(), interfaceFileSets.end(),
                     fileSetInTargetExport)) {
      return false;
    }
  }

  return true;
}